

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O1

void __thiscall xercesc_4_0::XMLReader::cleanup(XMLReader *this,EVP_PKEY_CTX *ctx)

{
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fEncodingStr);
  this->fEncodingStr = (XMLCh *)0x0;
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPublicId);
  this->fPublicId = (XMLCh *)0x0;
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fSystemId);
  this->fSystemId = (XMLCh *)0x0;
  if (this->fStream != (BinInputStream *)0x0) {
    (*this->fStream->_vptr_BinInputStream[1])();
  }
  this->fStream = (BinInputStream *)0x0;
  if (this->fTranscoder != (XMLTranscoder *)0x0) {
    (*this->fTranscoder->_vptr_XMLTranscoder[1])();
  }
  this->fTranscoder = (XMLTranscoder *)0x0;
  return;
}

Assistant:

void XMLReader::cleanup()
{
    fMemoryManager->deallocate(fEncodingStr);
    fEncodingStr = NULL;
    fMemoryManager->deallocate(fPublicId);
    fPublicId = NULL;
    fMemoryManager->deallocate(fSystemId);
    fSystemId = NULL;
    delete fStream;
    fStream = NULL;
    delete fTranscoder;
    fTranscoder = NULL;
}